

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall testing::internal::Mutex::Mutex(Mutex *this)

{
  int iVar1;
  ostream *poVar2;
  long in_FS_OFFSET;
  int gtest_error;
  Mutex *this_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    GTestLog::GTestLog((GTestLog *)((long)&this_local + 4),GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x846);
    poVar2 = GTestLog::GetStream((GTestLog *)((long)&this_local + 4));
    poVar2 = std::operator<<(poVar2,"pthread_mutex_init(&mutex_, NULL)");
    poVar2 = std::operator<<(poVar2,"failed with error ");
    std::ostream::operator<<(poVar2,iVar1);
    GTestLog::~GTestLog((GTestLog *)((long)&this_local + 4));
  }
  (this->super_MutexBase).has_owner_ = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Mutex() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_init(&mutex_, NULL));
    has_owner_ = false;
  }